

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

ByteData *
cfd::core::ConfidentialTransaction::GetBitcoinTransaction
          (ByteData *__return_storage_ptr__,ByteData *bitcoin_tx_data,bool is_remove_witness)

{
  uint32_t flags;
  wally_tx *tx;
  uchar *puVar1;
  size_type sVar2;
  undefined8 uVar3;
  CfdException *this;
  ByteData *in_stack_fffffffffffffd38;
  ByteData *in_stack_fffffffffffffd40;
  string *in_stack_fffffffffffffd50;
  size_type in_stack_fffffffffffffd58;
  CfdError CVar4;
  CfdException *in_stack_fffffffffffffd60;
  CfdException *cfd_except;
  ByteData local_1a8;
  undefined1 local_18a;
  allocator local_189;
  string local_188 [32];
  CfdSourceLocation local_168;
  undefined1 local_148 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  string local_128 [32];
  CfdSourceLocation local_108;
  undefined1 local_ea;
  allocator local_e9;
  string local_e8 [32];
  CfdSourceLocation local_c8;
  size_t local_b0;
  size_t vsize;
  size_t size;
  uint32_t flag;
  CfdSourceLocation local_78;
  int local_4c;
  wally_tx *pwStack_48;
  int ret;
  wally_tx *tx_pointer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_28;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *byte_data;
  ByteData *pBStack_18;
  bool is_remove_witness_local;
  ByteData *bitcoin_tx_data_local;
  ByteData *result;
  
  byte_data._7_1_ = is_remove_witness;
  pBStack_18 = bitcoin_tx_data;
  bitcoin_tx_data_local = __return_storage_ptr__;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tx_pointer,
                     bitcoin_tx_data);
  pwStack_48 = (wally_tx *)0x0;
  local_28 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tx_pointer;
  puVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tx_pointer);
  sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_28);
  local_4c = wally_tx_from_bytes(puVar1,sVar2,0,&stack0xffffffffffffffb8);
  if (local_4c != 0) {
    local_78.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    CVar4 = (CfdError)(in_stack_fffffffffffffd58 >> 0x20);
    local_78.filename = local_78.filename + 1;
    local_78.line = 0xe9b;
    local_78.funcname = "GetBitcoinTransaction";
    logger::warn<int&>(&local_78,"wally_tx_from_bytes NG[{}] ",&local_4c);
    size._6_1_ = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&flag,"transaction data invalid.",(allocator *)((long)&size + 7));
    CfdException::CfdException(in_stack_fffffffffffffd60,CVar4,in_stack_fffffffffffffd50);
    size._6_1_ = 0;
    __cxa_throw(uVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  size._5_1_ = 0;
  ByteData::ByteData(__return_storage_ptr__);
  size._0_4_ = (byte)~byte_data._7_1_ & 1;
  vsize = 0;
  local_b0 = 0;
  local_4c = wally_tx_get_length(pwStack_48,(uint)size,&vsize);
  if (local_4c != 0) {
    local_c8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    CVar4 = (CfdError)(in_stack_fffffffffffffd58 >> 0x20);
    local_c8.filename = local_c8.filename + 1;
    local_c8.line = 0xea6;
    local_c8.funcname = "GetBitcoinTransaction";
    logger::warn<int&>(&local_c8,"wally_tx_get_length NG[{}].",&local_4c);
    local_ea = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_e8,"bitcoin tx convert error.",&local_e9);
    CfdException::CfdException(in_stack_fffffffffffffd60,CVar4,in_stack_fffffffffffffd50);
    local_ea = 0;
    __cxa_throw(uVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if ((uint)size != 0) {
    local_4c = wally_tx_get_vsize(pwStack_48,&local_b0);
    if (local_4c != 0) {
      local_108.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                   ,0x2f);
      CVar4 = (CfdError)(in_stack_fffffffffffffd58 >> 0x20);
      local_108.filename = local_108.filename + 1;
      local_108.line = 0xeac;
      local_108.funcname = "GetBitcoinTransaction";
      logger::warn<int&>(&local_108,"wally_tx_get_vsize NG[{}].",&local_4c);
      buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
      uVar3 = __cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_128,"bitcoin tx convert error.",
                 (allocator *)
                 ((long)&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      CfdException::CfdException(in_stack_fffffffffffffd60,CVar4,in_stack_fffffffffffffd50);
      buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
      __cxa_throw(uVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if (vsize == local_b0) {
      size._0_4_ = 0;
    }
  }
  local_4c = 0;
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x4c0c46);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd60,
             in_stack_fffffffffffffd58,(allocator_type *)in_stack_fffffffffffffd50);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x4c0c6e);
  tx = pwStack_48;
  flags = (uint)size;
  puVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4c0c98);
  sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_148);
  local_4c = wally_tx_to_bytes(tx,flags,puVar1,sVar2,&vsize);
  if (local_4c != 0) {
    local_168.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    CVar4 = (CfdError)(in_stack_fffffffffffffd58 >> 0x20);
    local_168.filename = local_168.filename + 1;
    local_168.line = 0xeb7;
    local_168.funcname = "GetBitcoinTransaction";
    logger::warn<int&>(&local_168,"wally_tx_to_bytes NG[{}].",&local_4c);
    local_18a = 1;
    this = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_188,"bitcoin tx convert error.",&local_189);
    CfdException::CfdException(this,CVar4,in_stack_fffffffffffffd50);
    local_18a = 0;
    __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
  }
  sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_148);
  if (sVar2 != vsize) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd60,
               in_stack_fffffffffffffd58);
  }
  ByteData::ByteData(&local_1a8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_148);
  ByteData::operator=(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  ByteData::~ByteData((ByteData *)0x4c0e9f);
  wally_tx_free(pwStack_48);
  pwStack_48 = (wally_tx *)0x0;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd50);
  size._5_1_ = 1;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd50);
  return __return_storage_ptr__;
}

Assistant:

ByteData ConfidentialTransaction::GetBitcoinTransaction(
    const ByteData &bitcoin_tx_data, bool is_remove_witness) {
  const std::vector<uint8_t> &byte_data = bitcoin_tx_data.GetBytes();
  struct wally_tx *tx_pointer = NULL;
  int ret =
      wally_tx_from_bytes(byte_data.data(), byte_data.size(), 0, &tx_pointer);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_from_bytes NG[{}] ", ret);
    throw CfdException(kCfdIllegalArgumentError, "transaction data invalid.");
  }

  ByteData result;
  try {
    uint32_t flag = (is_remove_witness) ? 0 : WALLY_TX_FLAG_USE_WITNESS;
    size_t size = 0;
    size_t vsize = 0;
    ret = wally_tx_get_length(tx_pointer, flag, &size);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_tx_get_length NG[{}].", ret);
      throw CfdException(kCfdIllegalStateError, "bitcoin tx convert error.");
    }
    if (flag != 0) {
      ret = wally_tx_get_vsize(tx_pointer, &vsize);
      if (ret != WALLY_OK) {
        warn(CFD_LOG_SOURCE, "wally_tx_get_vsize NG[{}].", ret);
        throw CfdException(kCfdIllegalStateError, "bitcoin tx convert error.");
      }
      if (size == vsize) {
        flag = 0;
      }
    }
    std::vector<uint8_t> buffer(size);
    ret = wally_tx_to_bytes(
        tx_pointer, flag, buffer.data(), buffer.size(), &size);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_tx_to_bytes NG[{}].", ret);
      throw CfdException(kCfdIllegalStateError, "bitcoin tx convert error.");
    }
    if (buffer.size() != size) {
      buffer.resize(size);
    }
    result = ByteData(buffer);
    wally_tx_free(tx_pointer);
    tx_pointer = nullptr;
  } catch (const CfdException &cfd_except) {
    wally_tx_free(tx_pointer);
    throw cfd_except;
  } catch (...) {
    wally_tx_free(tx_pointer);
    warn(CFD_LOG_SOURCE, "unknown exception.");
    throw CfdException(kCfdIllegalStateError, "bitcoin tx convert error.");
  }
  return result;
}